

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O3

bool adiak::internal::create_container_type<std::vector<int,_std::allocator<int>_>_>::make_value
               (vector<int,_std::allocator<int>_> *c,adiak_value_t *value,adiak_datatype_t *dtype)

{
  pointer piVar1;
  int *piVar2;
  int *piVar3;
  iterator i;
  pointer piVar4;
  
  piVar4 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = (int *)malloc(((long)piVar1 - (long)piVar4) * 2);
  piVar3 = piVar2;
  for (; piVar1 != piVar4; piVar4 = piVar4 + 1) {
    *piVar3 = *piVar4;
    piVar3 = piVar3 + 2;
  }
  value->v_ptr = piVar2;
  dtype->num_elements =
       (int)((ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  return true;
}

Assistant:

static bool make_value(T &c, adiak_value_t *value, adiak_datatype_t *dtype) {
            adiak_value_t *valarray = (adiak_value_t *) malloc(sizeof(adiak_value_t) * c.size());
            int j = 0;
            for (typename T::iterator i = c.begin(); i != c.end(); i++) {
               bool result = parse<typename T::value_type>::make_value(*i, valarray + j++, dtype->subtype[0]);               
               if (!result)
                  return false;
            }
            element_type<T>::set(*value, valarray);
            dtype->num_elements = c.size();
            return true;
         }